

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::TrackActivationObjectPropertyForDebugger
          (ByteCodeGenerator *this,DebuggerScope *debuggerScope,Symbol *symbol,
          DebuggerScopePropertyFlags flags,bool isFunctionDeclaration)

{
  code *pcVar1;
  bool bVar2;
  RegSlot location_00;
  PropertyId propertyId_00;
  undefined4 *puVar3;
  ByteCodeWriter *this_00;
  PropertyId propertyId;
  RegSlot location;
  bool isFunctionDeclaration_local;
  DebuggerScopePropertyFlags flags_local;
  Symbol *symbol_local;
  DebuggerScope *debuggerScope_local;
  ByteCodeGenerator *this_local;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16c,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (symbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16d,"(symbol)","symbol");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ShouldTrackDebuggerMetadata(this);
  if ((bVar2) && (bVar2 = Symbol::GetIsTrackedForDebugger(symbol), !bVar2)) {
    location_00 = Symbol::GetLocation(symbol);
    propertyId_00 = Symbol::EnsurePosition(symbol,this);
    this_00 = Writer(this);
    Js::ByteCodeWriter::AddPropertyToDebuggerScope
              (this_00,debuggerScope,location_00,propertyId_00,false,flags,isFunctionDeclaration);
    Symbol::SetIsTrackedForDebugger(symbol,true);
  }
  return;
}

Assistant:

void ByteCodeGenerator::TrackActivationObjectPropertyForDebugger(
    Js::DebuggerScope *debuggerScope,
    Symbol *symbol,
    Js::DebuggerScopePropertyFlags flags /*= Js::DebuggerScopePropertyFlags_None*/,
    bool isFunctionDeclaration /*= false*/)
{
    Assert(debuggerScope);
    Assert(symbol);

    // Only need to track activation object properties in debug mode.
    if (ShouldTrackDebuggerMetadata() && !symbol->GetIsTrackedForDebugger())
    {
        Js::RegSlot location = symbol->GetLocation();
        Js::PropertyId propertyId = symbol->EnsurePosition(this);

        this->Writer()->AddPropertyToDebuggerScope(
            debuggerScope,
            location,
            propertyId,
            /*shouldConsumeRegister*/ false,
            flags,
            isFunctionDeclaration);

        symbol->SetIsTrackedForDebugger(true);
    }
}